

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O2

KeyboardMapping *
Tunings::startScaleOnAndTuneNoteTo
          (KeyboardMapping *__return_storage_ptr__,int scaleStart,int midiNote,double freq)

{
  ostream *poVar1;
  string local_1c0;
  locale local_1a0 [8];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::locale::locale((locale *)&local_1c0,"C");
  std::ios::imbue(local_1a0);
  std::locale::~locale(local_1a0);
  std::locale::~locale((locale *)&local_1c0);
  poVar1 = std::operator<<((ostream *)&oss,"! Automatically generated mapping, tuning note ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,midiNote);
  std::operator<<(poVar1," to ");
  poVar1 = std::ostream::_M_insert<double>(freq);
  poVar1 = std::operator<<(poVar1," Hz\n");
  poVar1 = std::operator<<(poVar1,"!\n");
  poVar1 = std::operator<<(poVar1,"! Size of map\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"! First and last MIDI notes to map - map the entire keyboard\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x7f);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"! Middle note where the first entry in the scale is mapped.\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,scaleStart);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"! Reference note where frequency is fixed\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,midiNote);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"! Frequency for MIDI note ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,midiNote);
  std::operator<<(poVar1,"\n");
  poVar1 = std::ostream::_M_insert<double>(freq);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,
                           "! Scale degree for formal octave. This is an empty mapping, so:\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"! Mapping. This is an empty mapping so list no keys\n");
  std::__cxx11::stringbuf::str();
  parseKBMData(__return_storage_ptr__,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

inline KeyboardMapping startScaleOnAndTuneNoteTo(int scaleStart, int midiNote, double freq)
{
    std::ostringstream oss;
    oss.imbue(std::locale("C"));
    oss << "! Automatically generated mapping, tuning note " << midiNote << " to " << freq
        << " Hz\n"
        << "!\n"
        << "! Size of map\n"
        << 0 << "\n"
        << "! First and last MIDI notes to map - map the entire keyboard\n"
        << 0 << "\n"
        << 127 << "\n"
        << "! Middle note where the first entry in the scale is mapped.\n"
        << scaleStart << "\n"
        << "! Reference note where frequency is fixed\n"
        << midiNote << "\n"
        << "! Frequency for MIDI note " << midiNote << "\n"
        << freq << "\n"
        << "! Scale degree for formal octave. This is an empty mapping, so:\n"
        << 0 << "\n"
        << "! Mapping. This is an empty mapping so list no keys\n";

    return parseKBMData(oss.str());
}